

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(cmStateSnapshot *this)

{
  string_view value;
  string *psVar1;
  allocator<char> local_189;
  string local_188;
  string_view local_168;
  allocator<char> local_151;
  string local_150;
  string_view local_130;
  allocator<char> local_119;
  string local_118;
  string_view local_f8;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  cmValue local_98;
  string local_90 [8];
  string currentBinDir;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  string local_30 [8];
  string currentSrcDir;
  cmStateSnapshot *this_local;
  
  currentSrcDir.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_CURRENT_SOURCE_DIR",&local_59);
  local_38 = GetDefinition(this,&local_58);
  psVar1 = cmValue::operator*[abi_cxx11_(&local_38);
  std::__cxx11::string::string(local_30,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_CURRENT_BINARY_DIR",&local_b9);
  local_98 = GetDefinition(this,&local_b8);
  psVar1 = cmValue::operator*[abi_cxx11_(&local_98);
  std::__cxx11::string::string(local_90,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  InitializeFromParent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"CMAKE_SOURCE_DIR",&local_e1);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  local_f8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1)
  ;
  SetDefinition(this,&local_e0,local_f8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CMAKE_BINARY_DIR",&local_119);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  local_130 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1);
  SetDefinition(this,&local_118,local_130);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"CMAKE_CURRENT_SOURCE_DIR",&local_151);
  local_168 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
  SetDefinition(this,&local_150,local_168);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"CMAKE_CURRENT_BINARY_DIR",&local_189);
  value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_90);
  SetDefinition(this,&local_188,value);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmStateSnapshot::InitializeFromParent_ForSubdirsCommand()
{
  std::string currentSrcDir = *this->GetDefinition("CMAKE_CURRENT_SOURCE_DIR");
  std::string currentBinDir = *this->GetDefinition("CMAKE_CURRENT_BINARY_DIR");
  this->InitializeFromParent();
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());

  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR", currentSrcDir);
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR", currentBinDir);
}